

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PopulationDirector.cpp
# Opt level: O3

shared_ptr<Population> __thiscall
PopulationDirector::makeAverage(PopulationDirector *this,string *name)

{
  TypeName TVar1;
  int32_t iVar2;
  RandomGenerator *pRVar3;
  Config *pCVar4;
  pair<int,_int> pVar5;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *plVar6;
  shared_ptr<Population> sVar7;
  Population *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  plVar6 = (long *)(name->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,*in_RDX,in_RDX[1] + *in_RDX);
  (**(code **)(*plVar6 + 8))(plVar6,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  (*(code *)**(undefined8 **)(name->_M_dataplus)._M_p)();
  (**(code **)(*(long *)(name->_M_dataplus)._M_p + 0x58))(&local_60);
  TVar1 = Population::GetType(local_60);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  plVar6 = (long *)(name->_M_dataplus)._M_p;
  pRVar3 = RandomGenerator::getInstance();
  pCVar4 = Config::getInstance();
  if (TVar1 == HERBIVORE) {
    pVar5 = Config::getHerbivoreAverageAnimalAmount(pCVar4);
    iVar2 = RandomGenerator::randNormalInt(pRVar3,pVar5);
    (**(code **)(*plVar6 + 0x10))(plVar6,iVar2);
    plVar6 = (long *)(name->_M_dataplus)._M_p;
    pRVar3 = RandomGenerator::getInstance();
    pCVar4 = Config::getInstance();
    pVar5 = Config::getHerbivoreAverageHealth(pCVar4);
    iVar2 = RandomGenerator::randNormalInt(pRVar3,pVar5);
    (**(code **)(*plVar6 + 0x18))(plVar6,iVar2);
    plVar6 = (long *)(name->_M_dataplus)._M_p;
    pRVar3 = RandomGenerator::getInstance();
    pCVar4 = Config::getInstance();
    pVar5 = Config::getHerbivoreAverageProductivity(pCVar4);
    iVar2 = RandomGenerator::randNormalInt(pRVar3,pVar5);
    (**(code **)(*plVar6 + 0x20))(plVar6,iVar2);
    plVar6 = (long *)(name->_M_dataplus)._M_p;
    pRVar3 = RandomGenerator::getInstance();
    pCVar4 = Config::getInstance();
    pVar5 = Config::getHerbivoreAverageBiologyDev(pCVar4);
  }
  else {
    pVar5 = Config::getCarnivoreAverageAnimalAmount(pCVar4);
    iVar2 = RandomGenerator::randNormalInt(pRVar3,pVar5);
    (**(code **)(*plVar6 + 0x10))(plVar6,iVar2);
    plVar6 = (long *)(name->_M_dataplus)._M_p;
    pRVar3 = RandomGenerator::getInstance();
    pCVar4 = Config::getInstance();
    pVar5 = Config::getCarnivoreAverageHealth(pCVar4);
    iVar2 = RandomGenerator::randNormalInt(pRVar3,pVar5);
    (**(code **)(*plVar6 + 0x18))(plVar6,iVar2);
    plVar6 = (long *)(name->_M_dataplus)._M_p;
    pRVar3 = RandomGenerator::getInstance();
    pCVar4 = Config::getInstance();
    pVar5 = Config::getCarnivoreAverageProductivity(pCVar4);
    iVar2 = RandomGenerator::randNormalInt(pRVar3,pVar5);
    (**(code **)(*plVar6 + 0x20))(plVar6,iVar2);
    plVar6 = (long *)(name->_M_dataplus)._M_p;
    pRVar3 = RandomGenerator::getInstance();
    pCVar4 = Config::getInstance();
    pVar5 = Config::getCarnivoreAverageBiologyDev(pCVar4);
  }
  iVar2 = RandomGenerator::randNormalInt(pRVar3,pVar5);
  (**(code **)(*plVar6 + 0x28))(plVar6,iVar2);
  plVar6 = (long *)(name->_M_dataplus)._M_p;
  (**(code **)(*plVar6 + 0x30))(plVar6,2);
  plVar6 = (long *)(name->_M_dataplus)._M_p;
  (**(code **)(*plVar6 + 0x38))(plVar6,2);
  plVar6 = (long *)(name->_M_dataplus)._M_p;
  (**(code **)(*plVar6 + 0x40))(plVar6,2);
  plVar6 = (long *)(name->_M_dataplus)._M_p;
  (**(code **)(*plVar6 + 0x48))(plVar6,2);
  (**(code **)(*(long *)(name->_M_dataplus)._M_p + 0x58))(&local_60);
  (this->builder).super___shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_60;
  (this->builder).super___shared_ptr<PopulationBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_58;
  (**(code **)(*(long *)(name->_M_dataplus)._M_p + 0x50))();
  sVar7.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar7.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Population>)sVar7.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Population> PopulationDirector::makeAverage(const std::string &name) {
  builder->setName(name);
  builder->setType();
  if (builder->getProduct()->GetType() == Population::TypeName::HERBIVORE) {
    builder->setAmount(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHerbivoreAverageAnimalAmount()));
    builder->setHealth(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHerbivoreAverageHealth()));
    builder->setProductivity(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHerbivoreAverageProductivity()));
    builder->setBiologyDev(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHerbivoreAverageBiologyDev()));
    builder->setSize(Population::AVERAGE);
    builder->setSafety(Population::AVERAGE);
    builder->setVelocity(Population::AVERAGE);
    builder->setCover(Population::AVERAGE);
  } else {
    builder->setAmount(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getCarnivoreAverageAnimalAmount()));
    builder->setHealth(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getCarnivoreAverageHealth()));
    builder->setProductivity(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getCarnivoreAverageProductivity()));
    builder->setBiologyDev(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getCarnivoreAverageBiologyDev()));
    builder->setSize(Population::AVERAGE);
    builder->setSafety(Population::AVERAGE);
    builder->setVelocity(Population::AVERAGE);
    builder->setCover(Population::AVERAGE);
  }
  auto oldPtr = std::move(builder -> getProduct());
  builder -> resetPopulation();

  return oldPtr;
}